

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O3

int google::protobuf::internal::UTF8GenericScan
              (UTF8ScanObj *st,char *str,int str_length,int *bytes_consumed)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  uint8 *puVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  int iVar8;
  uint8 *Tbl0;
  uint8 *puVar9;
  uint8 *puVar10;
  uint *puVar11;
  
  iVar8 = (int)str;
  *bytes_consumed = 0;
  if (str_length == 0) {
    return 0xf1;
  }
  puVar1 = (uint *)(str + str_length);
  puVar6 = (uint *)(str + (long)str_length + -7);
  puVar9 = st->state_table + st->state0;
  puVar4 = st->fast_state;
  do {
    uVar7 = (ulong)str & 7;
    puVar11 = (uint *)str;
    if (str < puVar1 && uVar7 != 0) {
      do {
        if (puVar4[(byte)*(uint *)str] != '\0') goto LAB_0027ad9c;
        str = (char *)((long)str + 1);
        uVar7 = (ulong)((long)puVar11 + 1) & 7;
      } while ((uVar7 != 0) && (puVar11 = (uint *)((long)puVar11 + 1), str < puVar1));
    }
    if (str < puVar6 && uVar7 == 0) {
      puVar11 = (uint *)((long)str + 4);
      do {
        str = (char *)puVar11;
        uVar5 = *(uint *)((long)str + -4);
        uVar3 = *(uint *)str;
        if (((uVar3 + st->hiadd | uVar3 - st->losub | uVar5 + st->hiadd | uVar5 - st->losub) &
            0x80808080) != 0) {
          if (((puVar4[uVar5 >> 8 & 0xff] != '\0' || puVar4[(byte)uVar5] != '\0') ||
              puVar4[uVar5 >> 0x10 & 0xff] != '\0') || puVar4[uVar5 >> 0x18] != '\0') {
            str = (char *)((long)str + -4);
            goto LAB_0027ad9c;
          }
          if (((puVar4[(ulong)(uVar3 >> 8) & 0xff] != '\0' || puVar4[(ulong)uVar3 & 0xff] != '\0')
              || puVar4[(ulong)(uVar3 >> 0x10) & 0xff] != '\0') || puVar4[uVar3 >> 0x18] != '\0')
          goto LAB_0027ad9c;
        }
        puVar11 = (uint *)((long)str + 8);
      } while ((uint *)((long)str + 4) < puVar6);
      str = (char *)((long)str + 4);
    }
LAB_0027ad9c:
    puVar10 = puVar9;
    if (puVar1 <= str) {
LAB_0027ae03:
      uVar5 = 0xf1;
      if (st->state0_size <= (uint)((int)puVar10 - (int)puVar9)) {
        uVar5 = 0xf0;
        str = (char *)((long)str + -1);
      }
      break;
    }
    puVar11 = (uint *)((long)str + -1);
    while( true ) {
      bVar2 = puVar10[(byte)*(uint *)str];
      uVar5 = (uint)bVar2;
      if (0xef < bVar2) break;
      str = (char *)((long)str + 1);
      puVar10 = puVar9 + (int)((uint)bVar2 << ((byte)st->entry_shift & 0x1f));
      puVar11 = (uint *)((long)puVar11 + 1);
      if (puVar1 <= str) goto LAB_0027ae03;
    }
    if (st->state0_size <= (uint)((int)puVar10 - (int)puVar9)) {
      str = (char *)puVar11;
    }
  } while (bVar2 == 0xfd);
  *bytes_consumed = (int)str - iVar8;
  return uVar5;
}

Assistant:

int UTF8GenericScan(const UTF8ScanObj* st,
                    const char * str,
                    int str_length,
                    int* bytes_consumed) {
  *bytes_consumed = 0;
  if (str_length == 0) return kExitOK;

  int eshift = st->entry_shift;
  const uint8* isrc = reinterpret_cast<const uint8*>(str);
  const uint8* src = isrc;
  const uint8* srclimit = isrc + str_length;
  const uint8* srclimit8 = srclimit - 7;
  const uint8* Tbl_0 = &st->state_table[st->state0];

 DoAgain:
  // Do state-table scan
  int e = 0;
  uint8 c;
  const uint8* Tbl2 = &st->fast_state[0];
  const uint32 losub = st->losub;
  const uint32 hiadd = st->hiadd;
  // Check initial few bytes one at a time until 8-byte aligned
  //----------------------------
  while ((((uintptr_t)src & 0x07) != 0) &&
         (src < srclimit) &&
         Tbl2[src[0]] == 0) {
    src++;
  }
  if (((uintptr_t)src & 0x07) == 0) {
    // Do fast for groups of 8 identity bytes.
    // This covers a lot of 7-bit ASCII ~8x faster then the 1-byte loop,
    // including slowing slightly on cr/lf/ht
    //----------------------------
    while (src < srclimit8) {
      uint32 s0123 = (reinterpret_cast<const uint32 *>(src))[0];
      uint32 s4567 = (reinterpret_cast<const uint32 *>(src))[1];
      src += 8;
      // This is a fast range check for all bytes in [lowsub..0x80-hiadd)
      uint32 temp = (s0123 - losub) | (s0123 + hiadd) |
                    (s4567 - losub) | (s4567 + hiadd);
      if ((temp & 0x80808080) != 0) {
        // We typically end up here on cr/lf/ht; src was incremented
        int e0123 = (Tbl2[src[-8]] | Tbl2[src[-7]]) |
                    (Tbl2[src[-6]] | Tbl2[src[-5]]);
        if (e0123 != 0) {
          src -= 8;
          break;
        }    // Exit on Non-interchange
        e0123 = (Tbl2[src[-4]] | Tbl2[src[-3]]) |
                (Tbl2[src[-2]] | Tbl2[src[-1]]);
        if (e0123 != 0) {
          src -= 4;
          break;
        }    // Exit on Non-interchange
        // Else OK, go around again
      }
    }
  }
  //----------------------------

  // Byte-at-a-time scan
  //----------------------------
  const uint8* Tbl = Tbl_0;
  while (src < srclimit) {
    c = *src;
    e = Tbl[c];
    src++;
    if (e >= kExitIllegalStructure) {break;}
    Tbl = &Tbl_0[e << eshift];
  }
  //----------------------------


  // Exit posibilities:
  //  Some exit code, !state0, back up over last char
  //  Some exit code, state0, back up one byte exactly
  //  source consumed, !state0, back up over partial char
  //  source consumed, state0, exit OK
  // For illegal byte in state0, avoid backup up over PREVIOUS char
  // For truncated last char, back up to beginning of it

  if (e >= kExitIllegalStructure) {
    // Back up over exactly one byte of rejected/illegal UTF-8 character
    src--;
    // Back up more if needed
    if (!InStateZero(st, Tbl)) {
      do {
        src--;
      } while ((src > isrc) && ((src[0] & 0xc0) == 0x80));
    }
  } else if (!InStateZero(st, Tbl)) {
    // Back up over truncated UTF-8 character
    e = kExitIllegalStructure;
    do {
      src--;
    } while ((src > isrc) && ((src[0] & 0xc0) == 0x80));
  } else {
    // Normal termination, source fully consumed
    e = kExitOK;
  }

  if (e == kExitDoAgain) {
    // Loop back up to the fast scan
    goto DoAgain;
  }

  *bytes_consumed = src - isrc;
  return e;
}